

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

double __thiscall
TwoStageDynamicBayesianNetwork::GetYProbabilityGeneral
          (TwoStageDynamicBayesianNetwork *this,Scope *Xscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *X,Scope *Ascope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *A,Scope *YIIscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *YII,Scope *Yscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Y)

{
  uint uVar1;
  uint uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  Scope *pSVar6;
  const_reference ppCVar7;
  Scope *in_RCX;
  long in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R8;
  allocator_type *in_R9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000018;
  double p_y;
  Index iiI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> YII_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X_restr;
  Index yVal;
  Index y;
  Index Y_index;
  double p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe98;
  Index y_00;
  undefined4 in_stack_fffffffffffffea0;
  Index in_stack_fffffffffffffea4;
  allocator_type *in_stack_fffffffffffffeb0;
  Scope *in_stack_fffffffffffffeb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffec0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffed8;
  Scope *in_stack_fffffffffffffee0;
  Scope *in_stack_fffffffffffffee8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffef0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff40;
  Index in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  Index in_stack_ffffffffffffff5c;
  TwoStageDynamicBayesianNetwork *in_stack_ffffffffffffff60;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3ff0000000000000;
  local_38 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3ff0000000000000;
  local_3c = 0;
  while( true ) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_stack_00000018);
    if (sVar4 <= local_3c) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                        (size_type)in_stack_fffffffffffffe98);
    uVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                        (size_type)in_stack_fffffffffffffe98);
    uVar2 = *pvVar5;
    y_00 = (Index)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    pSVar6 = GetXSoI_Y((TwoStageDynamicBayesianNetwork *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),y_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pSVar6->super_SDT);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaf3272);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaf329e);
    GetXSoI_Y((TwoStageDynamicBayesianNetwork *)
              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),y_00);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    pSVar6 = GetASoI_Y((TwoStageDynamicBayesianNetwork *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),y_00);
    in_stack_fffffffffffffef0 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pSVar6->super_SDT);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaf3333);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaf3359);
    in_stack_fffffffffffffed8 = in_R8;
    in_stack_fffffffffffffee0 = in_RCX;
    in_stack_fffffffffffffee8 =
         GetASoI_Y((TwoStageDynamicBayesianNetwork *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),y_00);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    pSVar6 = GetYSoI_Y((TwoStageDynamicBayesianNetwork *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),y_00);
    in_stack_fffffffffffffec0 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pSVar6->super_SDT);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaf33e8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaf340e);
    in_stack_fffffffffffffeb0 = in_R9;
    in_stack_fffffffffffffeb8 =
         GetYSoI_Y((TwoStageDynamicBayesianNetwork *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),y_00);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    in_stack_fffffffffffffea4 =
         IndividualToJointYiiIndices
                   (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                    in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff48 = in_stack_fffffffffffffea4;
    ppCVar7 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::
              operator[]((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                         (in_RDI + 0x280),(ulong)uVar1);
    (*(*ppCVar7)->_vptr_CPDDiscreteInterface[2])
              (*ppCVar7,(ulong)uVar2,(ulong)in_stack_ffffffffffffff48);
    local_38 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((double)pvVar8 * (double)local_38);
    pvVar3 = local_38;
    in_stack_fffffffffffffe98 = pvVar8;
    in_stack_ffffffffffffff40 = pvVar8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0);
    pvVar8 = pvVar3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0);
    local_3c = local_3c + 1;
  }
  return (double)local_38;
}

Assistant:

double TwoStageDynamicBayesianNetwork::
GetYProbabilityGeneral( 
                    const Scope& Xscope,
                    const vector<Index>& X,
                    const Scope& Ascope,
                    const vector<Index>& A,
                    const Scope& YIIscope,
                    const vector<Index>& YII,
                    const Scope& Yscope,
                    const vector<Index>& Y
                    ) const
{

    double p = 1.0;
    for(Index Y_index=0; Y_index < Y.size(); Y_index++)
    {
        //Y_index is index in vector Y
        Index y = Yscope.at(Y_index); // the index to the variable we look at
        Index yVal = Y.at(Y_index); // the value of that variable 

        vector<Index> X_restr(GetXSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(X, Xscope, GetXSoI_Y(y), X_restr );
        vector<Index> A_restr(GetASoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(A, Ascope, GetASoI_Y(y), A_restr );
        vector<Index> YII_restr(GetYSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(YII, YIIscope, GetYSoI_Y(y), YII_restr );
        Index iiI = IndividualToJointYiiIndices(y, X_restr, A_restr, YII_restr);
        double p_y = _m_Y_CPDs[y]->Get(yVal, iiI);
        p *= p_y;
    }
    return(p);
}